

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O3

wire_node_t * __thiscall
anon_unknown.dwarf_25fcf1::LogisimParser::point_on_wire(LogisimParser *this,Position position)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *node;
  undefined1 local_20 [8];
  
  if (this != (LogisimParser *)position.m_full) {
    do {
      _Var1 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                        ((((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &this->m_xml_doc)->_M_impl).super__Vector_impl_data._M_start,
                         this->m_lsim_context,local_20);
      if ((LSimContext *)_Var1._M_current != this->m_lsim_context) {
        return (wire_node_t *)this;
      }
      this = (LogisimParser *)&(this->m_circuits)._M_h._M_bucket_count;
    } while (this != (LogisimParser *)position.m_full);
  }
  return (wire_node_t *)0x0;
}

Assistant:

LogisimParser::wire_node_t *LogisimParser::point_on_wire(Position position) {

    for (auto &node : m_context.m_wires) {
        auto res = std::find(std::begin(node), std::end(node), position.m_full);
        if (res != std::end(node)) {
            return &node;
        }
    }

    return nullptr;
}